

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::constraintsJacobianWRTState
          (OptimalControlProblem *this,double time,VectorDynSize *state,VectorDynSize *control,
          MatrixDynSize *jacobian)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  _Rb_tree_header *p_Var6;
  _Rb_tree_node_base *p_Var7;
  ostream *poVar8;
  iDynTreeEigenMatrixMap jacobianMap;
  ostringstream errorMsg;
  string local_1f8;
  double local_1d8;
  VectorDynSize *local_1d0;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_1c8;
  Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>
  local_1a8 [4];
  
  local_1d8 = time;
  local_1d0 = control;
  uVar2 = getConstraintsDimension(this);
  uVar3 = iDynTree::MatrixDynSize::rows();
  if (uVar3 == uVar2) {
    lVar4 = iDynTree::MatrixDynSize::cols();
    lVar5 = iDynTree::VectorDynSize::size();
    if (lVar4 == lVar5) goto LAB_00181658;
  }
  iDynTree::VectorDynSize::size();
  iDynTree::MatrixDynSize::resize((ulong)jacobian,(ulong)uVar2);
LAB_00181658:
  toEigen(&local_1c8,jacobian);
  p_Var7 = (this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header;
  lVar4 = 0;
  do {
    if ((_Rb_tree_header *)p_Var7 == p_Var6) {
LAB_001817ec:
      return (_Rb_tree_header *)p_Var7 == p_Var6;
    }
    bVar1 = ConstraintsGroup::constraintJacobianWRTState
                      ((ConstraintsGroup *)**(undefined8 **)(p_Var7 + 2),local_1d8,state,local_1d0,
                       (MatrixDynSize *)(*(undefined8 **)(p_Var7 + 2) + 6));
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar8 = std::operator<<((ostream *)local_1a8,"Error while evaluating constraint group ");
      ConstraintsGroup::name_abi_cxx11_
                (&local_1f8,(ConstraintsGroup *)**(undefined8 **)(p_Var7 + 2));
      poVar8 = std::operator<<(poVar8,(string *)&local_1f8);
      std::operator<<(poVar8,".");
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                ("OptimalControlProblem","constraintsJacobianWRTState",local_1f8._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      goto LAB_001817ec;
    }
    toEigen((Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)&local_1f8,
            (MatrixDynSize *)(*(long *)(p_Var7 + 2) + 0x30));
    uVar2 = ConstraintsGroup::constraintsDimension
                      ((ConstraintsGroup *)**(undefined8 **)(p_Var7 + 2));
    local_1a8[0].
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
    .m_cols.m_value = iDynTree::VectorDynSize::size();
    local_1a8[0].
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
    .m_rows.m_value = (long)uVar2;
    local_1a8[0].
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
    .m_data = local_1c8.
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data + local_1c8.
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_cols.m_value * lVar4;
    local_1a8[0].
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value =
         local_1c8.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value;
    local_1a8[0].
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = local_1c8.
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data;
    local_1a8[0].
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_rows.m_value =
         local_1c8.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value;
    local_1a8[0].
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .m_startCol.m_value = 0;
    local_1a8[0].
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .m_outerStride =
         local_1c8.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value;
    local_1a8[0].
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .m_startRow.m_value = lVar4;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>>
              (local_1a8,
               (Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)&local_1f8)
    ;
    lVar5 = iDynTree::MatrixDynSize::rows();
    lVar4 = lVar4 + lVar5;
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
  } while( true );
}

Assistant:

bool OptimalControlProblem::constraintsJacobianWRTState(double time, const VectorDynSize &state, const VectorDynSize &control, MatrixDynSize &jacobian)
        {
            unsigned int nc = getConstraintsDimension();
            if ((jacobian.rows() != nc) || (jacobian.cols() != state.size())) {
                jacobian.resize(nc, state.size());
            }

            iDynTreeEigenMatrixMap jacobianMap = toEigen(jacobian);
            Eigen::Index offset = 0;

            for (auto& group : m_pimpl->constraintsGroups){
                if (!(group.second->group_ptr->constraintJacobianWRTState(time, state, control, group.second->stateJacobianBuffer))){
                    std::ostringstream errorMsg;
                    errorMsg << "Error while evaluating constraint group " << group.second->group_ptr->name() <<".";
                    reportError("OptimalControlProblem", "constraintsJacobianWRTState", errorMsg.str().c_str());
                    return false;
                }

                jacobianMap.block(offset, 0, group.second->group_ptr->constraintsDimension(), state.size()) = toEigen(group.second->stateJacobianBuffer);
                offset += group.second->stateJacobianBuffer.rows();
            }
            return true;
        }